

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::ShaderAtomicAndCase::ShaderAtomicAndCase
          (ShaderAtomicAndCase *this,Context *context,char *name,AtomicOperandType operandType,
          DataType type,Precision precision)

{
  byte bVar1;
  uint local_70;
  deUint32 valueMask;
  int numBits;
  Precision local_2c;
  DataType local_28;
  Precision precision_local;
  DataType type_local;
  AtomicOperandType operandType_local;
  char *name_local;
  Context *context_local;
  ShaderAtomicAndCase *this_local;
  
  local_2c = precision;
  local_28 = type;
  precision_local = operandType;
  _type_local = name;
  name_local = (char *)context;
  context_local = (Context *)this;
  tcu::Vector<unsigned_int,_3>::Vector((Vector<unsigned_int,_3> *)&valueMask,3,2,1);
  ShaderAtomicOpCase::ShaderAtomicOpCase
            (&this->super_ShaderAtomicOpCase,context,name,"atomicAnd",operandType,type,precision,
             (UVec3 *)&valueMask);
  (this->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderAtomicAndCase_032c1468;
  if ((this->super_ShaderAtomicOpCase).m_precision == PRECISION_HIGHP) {
    bVar1 = 0x20;
  }
  else {
    bVar1 = 8;
    if ((this->super_ShaderAtomicOpCase).m_precision == PRECISION_MEDIUMP) {
      bVar1 = 0x10;
    }
  }
  if (bVar1 == 0x20) {
    local_70 = 0xffffffff;
  }
  else {
    local_70 = (1 << (bVar1 & 0x1f)) - 1;
  }
  (this->super_ShaderAtomicOpCase).m_initialValue =
       ((1 << (bVar1 - 1 & 0x1f) | 1U) ^ 0xffffffff) & local_70;
  return;
}

Assistant:

ShaderAtomicAndCase (Context& context, const char* name, AtomicOperandType operandType, DataType type, Precision precision)
		: ShaderAtomicOpCase(context, name, "atomicAnd", operandType, type, precision, UVec3(3,2,1))
	{
		const int		numBits		= m_precision == PRECISION_HIGHP ? 32 :
									  m_precision == PRECISION_MEDIUMP ? 16 : 8;
		const deUint32	valueMask	= numBits == 32 ? ~0u : (1u<<numBits)-1u;
		m_initialValue = ~((1u<<(numBits-1u)) | 1u) & valueMask; // All bits except lowest and highest set.
	}